

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O1

void Abc_ResStartPart2(int nInputs,uint *uParts,int nParts)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  
  if (0 < nParts) {
    memset(uParts,0,(ulong)(uint)nParts * 4);
  }
  if (0 < nInputs) {
    iVar2 = 0;
    do {
      uParts[(long)iVar2 % (long)nParts & 0xffffffff] =
           uParts[(long)iVar2 % (long)nParts & 0xffffffff] | 1 << ((byte)iVar2 & 0x1f);
      iVar2 = iVar2 + 1;
    } while (nInputs != iVar2);
  }
  if (nParts < 1) {
    iVar2 = 0;
  }
  else {
    uVar1 = 0;
    iVar2 = 0;
    do {
      uVar3 = (uParts[uVar1] >> 1 & 0x55555555) + (uParts[uVar1] & 0x55555555);
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
      uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
      uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
      iVar2 = (uVar3 >> 0x10) + iVar2 + (uVar3 & 0xffff);
      uVar1 = uVar1 + 1;
    } while ((uint)nParts != uVar1);
  }
  if (iVar2 != nInputs) {
    __assert_fail("Count == nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x9e,"void Abc_ResStartPart2(int, unsigned int *, int)");
  }
  return;
}

Assistant:

void Abc_ResStartPart2( int nInputs, unsigned uParts[], int nParts )
{
    int i, Count = 0;
    for ( i = 0; i < nParts; i++ )
        uParts[i] = 0;
    for ( i = 0; i < nInputs; i++ )
        uParts[i % nParts] |= (1 << i);
    for ( i = 0; i < nParts; i++ )
        Count += Extra_WordCountOnes( uParts[i] );
    assert( Count == nInputs );
}